

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCore.c
# Opt level: O2

Aig_Man_t * Csw_Sweep(Aig_Man_t *pAig,int nCutsMax,int nLeafMax,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *p;
  Aig_Man_t *pAVar2;
  abctime aVar3;
  Csw_Man_t *p_00;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  abctime aVar7;
  ulong uVar8;
  Aig_Obj_t *pAVar9;
  int iVar10;
  
  aVar3 = Abc_Clock();
  p_00 = Csw_ManStart(pAig,nCutsMax,nLeafMax,fVerbose);
  iVar10 = 0;
  while( true ) {
    p = p_00->pManRes->vCis;
    if (p->nSize <= iVar10) break;
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar10);
    Csw_ObjPrepareCuts(p_00,pAVar4,1);
    pvVar5 = Vec_PtrEntry(p_00->pManAig->vCis,iVar10);
    p_00->pnRefs[pAVar4->Id] = p_00->pnRefs[pAVar4->Id] + (*(uint *)((long)pvVar5 + 0x18) >> 6);
    iVar10 = iVar10 + 1;
  }
  iVar10 = 0;
  do {
    if (pAig->vObjs->nSize <= iVar10) {
      for (iVar10 = 0; iVar10 < pAig->vCos->nSize; iVar10 = iVar10 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar10);
        pAVar2 = p_00->pManRes;
        pAVar4 = Csw_ObjChild0Equiv(p_00,pAVar4);
        Aig_ObjCreateCo(pAVar2,pAVar4);
      }
      Aig_ManCleanup(p_00->pManRes);
      aVar7 = Abc_Clock();
      p_00->timeTotal = aVar7 - aVar3;
      pAVar2 = p_00->pManRes;
      p_00->timeOther = (aVar7 - aVar3) - (p_00->timeCuts + p_00->timeHash);
      Csw_ManStop(p_00);
      return pAVar2;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar10);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
      pAVar2 = p_00->pManRes;
      pAVar6 = Csw_ObjChild0Equiv(p_00,pAVar4);
      if (((ulong)pAVar4 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswInt.h"
                      ,0x75,"Aig_Obj_t *Csw_ObjChild1Equiv(Csw_Man_t *, Aig_Obj_t *)");
      }
      uVar8 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar9 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar9 = (Aig_Obj_t *)
                 ((ulong)((uint)pAVar4->pFanin1 & 1) ^ (ulong)p_00->pEquiv[*(int *)(uVar8 + 0x24)]);
      }
      pAVar6 = Aig_And(pAVar2,pAVar6,pAVar9);
      do {
        pAVar9 = Csw_ObjSweep(p_00,(Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe),
                              (uint)((*(uint *)&pAVar4->field_0x18 & 0xffffff80) != 0));
        pAVar6 = (Aig_Obj_t *)((ulong)((uint)pAVar6 & 1) ^ (ulong)pAVar9);
        iVar1 = *(int *)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x24);
        if (p_00->pCuts[iVar1] != (Csw_Cut_t *)0x0) break;
      } while ((*(uint *)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x18) & 7) != 1);
      p_00->pEquiv[pAVar4->Id] = pAVar6;
      p_00->pnRefs[iVar1] = p_00->pnRefs[iVar1] + (*(uint *)&pAVar4->field_0x18 >> 6);
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Csw_Sweep( Aig_Man_t * pAig, int nCutsMax, int nLeafMax, int fVerbose )
{
    Csw_Man_t * p;
    Aig_Man_t * pRes;
    Aig_Obj_t * pObj, * pObjNew, * pObjRes;
    int i;
    abctime clk;
clk = Abc_Clock();
    // start the manager
    p = Csw_ManStart( pAig, nCutsMax, nLeafMax, fVerbose );
    // set elementary cuts at the PIs
    Aig_ManForEachCi( p->pManRes, pObj, i )
    {
        Csw_ObjPrepareCuts( p, pObj, 1 );
        Csw_ObjAddRefs( p, pObj, Aig_ManCi(p->pManAig,i)->nRefs );
    }
    // process the nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        // create the new node
        pObjNew = Aig_And( p->pManRes, Csw_ObjChild0Equiv(p, pObj), Csw_ObjChild1Equiv(p, pObj) );
        // check if this node can be represented using another node
//        pObjRes = Csw_ObjSweep( p, Aig_Regular(pObjNew), pObj->nRefs > 1 );
//        pObjRes = Aig_NotCond( pObjRes, Aig_IsComplement(pObjNew) );
        // try recursively if resubsitution is used
        do {
            pObjRes = Csw_ObjSweep( p, Aig_Regular(pObjNew), pObj->nRefs > 1 );
            pObjRes = Aig_NotCond( pObjRes, Aig_IsComplement(pObjNew) );        
            pObjNew = pObjRes;
        } while ( Csw_ObjCuts(p, Aig_Regular(pObjNew)) == NULL && !Aig_ObjIsConst1(Aig_Regular(pObjNew)) );
        // save the resulting node
        Csw_ObjSetEquiv( p, pObj, pObjRes );
        // add to the reference counter
        Csw_ObjAddRefs( p, Aig_Regular(pObjRes), pObj->nRefs );
    }
    // add the POs
    Aig_ManForEachCo( pAig, pObj, i )
        Aig_ObjCreateCo( p->pManRes, Csw_ObjChild0Equiv(p, pObj) );
    // remove dangling nodes 
    Aig_ManCleanup( p->pManRes );
    // return the resulting manager
p->timeTotal = Abc_Clock() - clk;
p->timeOther = p->timeTotal - p->timeCuts - p->timeHash;
    pRes = p->pManRes;
    Csw_ManStop( p );
    return pRes;
}